

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktClippingTests.cpp
# Opt level: O0

void __thiscall
vkt::clipping::anon_unknown_0::ClipDistance::CaseDefinition::CaseDefinition
          (CaseDefinition *this,VkPrimitiveTopology topology_,int numClipDistances_,
          int numCullDistances_,bool enableTessellation_,bool enableGeometry_,bool dynamicIndexing_)

{
  bool dynamicIndexing__local;
  bool enableGeometry__local;
  bool enableTessellation__local;
  int numCullDistances__local;
  int numClipDistances__local;
  VkPrimitiveTopology topology__local;
  CaseDefinition *this_local;
  
  this->topology = topology_;
  this->dynamicIndexing = dynamicIndexing_;
  this->enableTessellation = enableTessellation_;
  this->enableGeometry = enableGeometry_;
  this->numClipDistances = numClipDistances_;
  this->numCullDistances = numCullDistances_;
  return;
}

Assistant:

CaseDefinition (const VkPrimitiveTopology	topology_,
					const int					numClipDistances_,
					const int					numCullDistances_,
					const bool					enableTessellation_,
					const bool					enableGeometry_,
					const bool					dynamicIndexing_)
		: topology					(topology_)
		, dynamicIndexing			(dynamicIndexing_)
		, enableTessellation		(enableTessellation_)
		, enableGeometry			(enableGeometry_)
		, numClipDistances			(numClipDistances_)
		, numCullDistances			(numCullDistances_)
	{
	}